

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

TemplateString * __thiscall
ctemplate::TemplateDictionary::GetValue
          (TemplateString *__return_storage_ptr__,TemplateDictionary *this,TemplateString *variable)

{
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *psVar1;
  char *pcVar2;
  size_t sVar3;
  undefined7 uVar4;
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
  *c;
  TemplateId TVar5;
  second_type *psVar6;
  TemplateDictionary *d;
  TemplateDictionary *pTVar7;
  VariableDict *template_global_vars;
  
  for (pTVar7 = this; pTVar7 != (TemplateDictionary *)0x0; pTVar7 = pTVar7->parent_dict_) {
    psVar1 = pTVar7->variable_dict_;
    if (psVar1 != (small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
                   *)0x0) {
      TVar5 = TemplateString::GetGlobalId(variable);
      psVar6 = find_ptr<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                         (psVar1,TVar5);
      if (psVar6 != (second_type *)0x0) goto LAB_00129a16;
    }
  }
  if (this->template_global_dict_owner_ == (TemplateDictionary *)0x0) {
    __assert_fail("template_global_dict_owner_ != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                  ,0x38b,
                  "virtual TemplateString ctemplate::TemplateDictionary::GetValue(const TemplateString &) const"
                 );
  }
  pTVar7 = this->template_global_dict_owner_->template_global_dict_;
  if ((pTVar7 != (TemplateDictionary *)0x0) &&
     (psVar1 = pTVar7->variable_dict_,
     psVar1 != (small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
                *)0x0)) {
    TVar5 = TemplateString::GetGlobalId(variable);
    psVar6 = find_ptr<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                       (psVar1,TVar5);
    if (psVar6 != (second_type *)0x0) {
LAB_00129a16:
      pcVar2 = psVar6->ptr_;
      sVar3 = psVar6->length_;
      uVar4 = *(undefined7 *)&psVar6->field_0x11;
      TVar5 = psVar6->id_;
      __return_storage_ptr__->is_immutable_ = psVar6->is_immutable_;
      *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar4;
      __return_storage_ptr__->id_ = TVar5;
      __return_storage_ptr__->ptr_ = pcVar2;
      __return_storage_ptr__->length_ = sVar3;
      return __return_storage_ptr__;
    }
  }
  Mutex::ReaderLock((Mutex *)g_static_mutex);
  c = global_dict_;
  TVar5 = TemplateString::GetGlobalId(variable);
  psVar6 = find_ptr<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>,unsigned_long>
                     (c,TVar5);
  if (psVar6 == (second_type *)0x0) {
    psVar6 = empty_string_;
  }
  pcVar2 = psVar6->ptr_;
  sVar3 = psVar6->length_;
  uVar4 = *(undefined7 *)&psVar6->field_0x11;
  TVar5 = psVar6->id_;
  __return_storage_ptr__->is_immutable_ = psVar6->is_immutable_;
  *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar4;
  __return_storage_ptr__->id_ = TVar5;
  __return_storage_ptr__->ptr_ = pcVar2;
  __return_storage_ptr__->length_ = sVar3;
  Mutex::ReaderUnlock((Mutex *)g_static_mutex);
  return __return_storage_ptr__;
}

Assistant:

LOCKS_EXCLUDED(g_static_mutex) {
  for (const TemplateDictionary* d = this; d; d = d->parent_dict_) {
    if (d->variable_dict_) {
      if (const TemplateString* it = find_ptr(*d->variable_dict_, variable.GetGlobalId()))
        return *it;
    }
  }

  // No match in the dict tree. Check the template-global dict.
  assert(template_global_dict_owner_ != NULL);
  if (template_global_dict_owner_->template_global_dict_
      && template_global_dict_owner_->template_global_dict_->variable_dict_) {
    const VariableDict* template_global_vars =
        template_global_dict_owner_->template_global_dict_->variable_dict_;

    if (const TemplateString* it = find_ptr(*template_global_vars, variable.GetGlobalId()))
      return *it;
  }

  // No match in dict tree or template-global dict.  Last chance: global dict.
  {
    ReaderMutexLock ml(&g_static_mutex);
    if (const TemplateString* it = find_ptr(*global_dict_, variable.GetGlobalId()))
      return *it;
    return *empty_string_;
  }
}